

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O3

target_ulong helper_lsl_x86_64(CPUX86State *env,target_ulong selector1)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  abi_ptr addr;
  uint uVar8;
  uintptr_t unaff_retaddr;
  
  uVar1 = cpu_cc_compute_all_x86_64(env,env->cc_op);
  uVar8 = (uint)selector1;
  if ((selector1 & 0xfffc) != 0) {
    lVar4 = 0x148;
    if ((selector1 & 4) == 0) {
      lVar4 = 0x178;
    }
    if ((uVar8 & 0xffff | 7) <= *(uint *)((long)env->regs + lVar4 + 0x10)) {
      uVar6 = 2;
      uVar5 = 2;
      addr = (ulong)(uVar8 & 0xfff8) + *(long *)((long)env->regs + lVar4 + 8);
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar5 = 0, (~env->hflags & 3) != 0)) {
        uVar5 = (uint)env->eflags >> 0x11 & 2;
      }
      uVar2 = cpu_ldl_mmuidx_ra_x86_64(env,addr,uVar5,unaff_retaddr);
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar6 = 0, (~env->hflags & 3) != 0)) {
        uVar6 = (uint)env->eflags >> 0x11 & 2;
      }
      uVar3 = cpu_ldl_mmuidx_ra_x86_64(env,addr + 4,uVar6,unaff_retaddr);
      uVar5 = uVar3 >> 0xd & 3;
      uVar6 = env->hflags & 3;
      if ((uVar3 >> 0xc & 1) == 0) {
        uVar7 = uVar3 >> 8 & 0xf;
        if ((uVar7 < 0xc) &&
           (((0xa0eU >> uVar7 & 1) != 0 && (uVar6 <= uVar5 && (uVar8 & 3) <= uVar5)))) {
LAB_0051bfef:
          uVar5 = uVar3 & 0xf0000 | uVar2 & 0xffff;
          uVar8 = uVar5 << 0xc | 0xfff;
          if ((uVar3 >> 0x17 & 1) == 0) {
            uVar8 = uVar5;
          }
          env->cc_src = (ulong)(uVar1 | 0x40);
          return (ulong)uVar8;
        }
      }
      else if (((~uVar3 & 0xc00) == 0) || ((uVar8 & 3) <= uVar5 && uVar6 <= uVar5))
      goto LAB_0051bfef;
    }
  }
  env->cc_src = (ulong)(uVar1 & 0xffffffbf);
  return 0;
}

Assistant:

target_ulong helper_lsl(CPUX86State *env, target_ulong selector1)
{
    unsigned int limit;
    uint32_t e1, e2, eflags, selector;
    int rpl, dpl, cpl, type;

    selector = selector1 & 0xffff;
    eflags = cpu_cc_compute_all(env, CC_OP);
    if ((selector & 0xfffc) == 0) {
        goto fail;
    }
    if (load_segment_ra(env, &e1, &e2, selector, GETPC()) != 0) {
        goto fail;
    }
    rpl = selector & 3;
    dpl = (e2 >> DESC_DPL_SHIFT) & 3;
    cpl = env->hflags & HF_CPL_MASK;
    if (e2 & DESC_S_MASK) {
        if ((e2 & DESC_CS_MASK) && (e2 & DESC_C_MASK)) {
            /* conforming */
        } else {
            if (dpl < cpl || dpl < rpl) {
                goto fail;
            }
        }
    } else {
        type = (e2 >> DESC_TYPE_SHIFT) & 0xf;
        switch (type) {
        case 1:
        case 2:
        case 3:
        case 9:
        case 11:
            break;
        default:
            goto fail;
        }
        if (dpl < cpl || dpl < rpl) {
        fail:
            CC_SRC = eflags & ~CC_Z;
            return 0;
        }
    }
    limit = get_seg_limit(e1, e2);
    CC_SRC = eflags | CC_Z;
    return limit;
}